

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::addTimerNode(Timer *this,TimerNode *newTimer)

{
  bool bVar1;
  TimerNode *pTVar2;
  undefined1 local_68 [8];
  TimerNode timer;
  undefined1 local_30 [16];
  iterator i;
  bool inserted;
  int32_t diff;
  TimerNode *newTimer_local;
  Timer *this_local;
  
  i.mNode._3_1_ = 0;
  JetHead::list<Timer::TimerNode>::begin((list<Timer::TimerNode> *)(local_30 + 8));
  while( true ) {
    JetHead::list<Timer::TimerNode>::end((list<Timer::TimerNode> *)local_30);
    bVar1 = JetHead::list<Timer::TimerNode>::iterator::operator!=
                      ((iterator *)(local_30 + 8),(iterator *)local_30);
    JetHead::list<Timer::TimerNode>::iterator::~iterator((iterator *)local_30);
    if (!bVar1) break;
    pTVar2 = JetHead::list<Timer::TimerNode>::iterator::operator*((iterator *)(local_30 + 8));
    TimerNode::TimerNode((TimerNode *)local_68,pTVar2);
    i.mNode._4_4_ = newTimer->mTick - timer.mListener._4_4_;
    if (i.mNode._4_4_ < 0) {
      JetHead::list<Timer::TimerNode>::iterator::insertBefore((iterator *)(local_30 + 8),newTimer);
      i.mNode._3_1_ = 1;
      timer.mRepeatMS = 2;
    }
    else {
      timer.mRepeatMS = 0;
    }
    TimerNode::~TimerNode((TimerNode *)local_68);
    if (timer.mRepeatMS != 0) goto LAB_00132207;
    JetHead::list<Timer::TimerNode>::iterator::operator++((iterator *)(local_30 + 8));
  }
  timer.mRepeatMS = 2;
LAB_00132207:
  JetHead::list<Timer::TimerNode>::iterator::~iterator((iterator *)(local_30 + 8));
  if ((i.mNode._3_1_ & 1) == 0) {
    JetHead::list<Timer::TimerNode>::push_back(&this->mList,newTimer);
  }
  return;
}

Assistant:

void Timer::addTimerNode( const TimerNode& newTimer )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	int32_t diff;
	bool inserted = false;

	// Add new timer node to the list (sorted)	
	for (JetHead::list<TimerNode>::iterator i = mList.begin();
		 i != mList.end(); ++i)
	{
		TimerNode timer = *i;
		diff = newTimer.mTick - timer.mTick;
		
		if ( diff < 0 )
		{
			i.insertBefore(newTimer);			
			inserted = true;
			break;
		}
	}
	
	if ( not inserted )
	{
		mList.push_back( newTimer );
	}
}